

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::TestVectorTypesInit(duckdb *this,ClientContext *context,TableFunctionInitInput *input)

{
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *puVar1;
  pointer puVar2;
  _Head_base<0UL,_duckdb::TestVectorTypesData_*,_false> _Var3;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> _Var4;
  FunctionData *pFVar5;
  pointer pTVar6;
  pointer pDVar7;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *entry;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *this_00;
  pointer this_01;
  pointer __y;
  vector<duckdb::TestType,_true> test_types;
  map<duckdb::LogicalTypeId,_duckdb::TestType,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>_>
  test_type_map;
  TestVectorInfo info;
  LogicalTypeId local_151;
  _Head_base<0UL,_duckdb::TestVectorTypesData_*,_false> local_150;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> local_148;
  FunctionData *local_140;
  vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> local_138;
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>_>
  local_120;
  undefined1 local_f0 [8];
  LogicalType local_e8;
  _Alloc_hider local_d0;
  char local_c0 [16];
  Value local_b0;
  Value local_70;
  
  local_148._M_head_impl = (GlobalTableFunctionState *)this;
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
  local_140 = (input->bind_data).ptr;
  local_150._M_head_impl = (TestVectorTypesData *)operator_new(0x28);
  ((local_150._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__TestVectorTypesData_024532d0;
  ((local_150._M_head_impl)->entries).
  super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_150._M_head_impl)->entries).
  super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_150._M_head_impl)->entries).
  super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_150._M_head_impl)->offset = 0;
  TestAllTypesFun::GetTestTypes((vector<duckdb::TestType,_true> *)&local_138,false);
  local_120._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120._M_impl.super__Rb_tree_header._M_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_138.super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_138.super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __y = local_138.super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
          super__Vector_impl_data._M_start;
    do {
      local_151 = (__y->type).id_;
      ::std::pair<duckdb::LogicalTypeId,_duckdb::TestType>::
      pair<duckdb::LogicalTypeId,_duckdb::TestType,_true>
                ((pair<duckdb::LogicalTypeId,_duckdb::TestType> *)local_f0,&local_151,__y);
      ::std::
      _Rb_tree<duckdb::LogicalTypeId,std::pair<duckdb::LogicalTypeId_const,duckdb::TestType>,std::_Select1st<std::pair<duckdb::LogicalTypeId_const,duckdb::TestType>>,std::less<duckdb::LogicalTypeId>,std::allocator<std::pair<duckdb::LogicalTypeId_const,duckdb::TestType>>>
      ::_M_emplace_unique<std::pair<duckdb::LogicalTypeId,duckdb::TestType>>
                ((_Rb_tree<duckdb::LogicalTypeId,std::pair<duckdb::LogicalTypeId_const,duckdb::TestType>,std::_Select1st<std::pair<duckdb::LogicalTypeId_const,duckdb::TestType>>,std::less<duckdb::LogicalTypeId>,std::allocator<std::pair<duckdb::LogicalTypeId_const,duckdb::TestType>>>
                  *)&local_120,(pair<duckdb::LogicalTypeId,_duckdb::TestType> *)local_f0);
      Value::~Value(&local_70);
      Value::~Value(&local_b0);
      if (local_d0._M_p != local_c0) {
        operator_delete(local_d0._M_p);
      }
      LogicalType::~LogicalType(&local_e8);
      __y = __y + 1;
    } while (__y != local_138.
                    super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  pTVar6 = unique_ptr<duckdb::TestVectorTypesData,_std::default_delete<duckdb::TestVectorTypesData>,_true>
           ::operator->((unique_ptr<duckdb::TestVectorTypesData,_std::default_delete<duckdb::TestVectorTypesData>,_true>
                         *)&local_150);
  pFVar5 = local_140;
  local_f0 = (undefined1  [8])(local_140 + 4);
  local_e8.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)&pTVar6->entries;
  local_e8._0_8_ = &local_120;
  TestVectorFlat::Generate((TestVectorInfo *)local_f0);
  TestVectorConstant::Generate((TestVectorInfo *)local_f0);
  TestVectorDictionary::Generate((TestVectorInfo *)local_f0);
  TestVectorSequence::Generate((TestVectorInfo *)local_f0);
  pTVar6 = unique_ptr<duckdb::TestVectorTypesData,_std::default_delete<duckdb::TestVectorTypesData>,_true>
           ::operator->((unique_ptr<duckdb::TestVectorTypesData,_std::default_delete<duckdb::TestVectorTypesData>,_true>
                         *)&local_150);
  _Var4._M_head_impl = local_148._M_head_impl;
  puVar1 = (pTVar6->entries).
           super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (pTVar6->entries).
                 super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1; this_00 = this_00 + 1
      ) {
    pDVar7 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       (this_00);
    DataChunk::Verify(pDVar7);
  }
  if (*(char *)&pFVar5[7]._vptr_FunctionData != '\0') {
    pTVar6 = unique_ptr<duckdb::TestVectorTypesData,_std::default_delete<duckdb::TestVectorTypesData>,_true>
             ::operator->((unique_ptr<duckdb::TestVectorTypesData,_std::default_delete<duckdb::TestVectorTypesData>,_true>
                           *)&local_150);
    puVar2 = (pTVar6->entries).
             super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_01 = (pTVar6->entries).
                   super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar2;
        this_01 = this_01 + 1) {
      pDVar7 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->(this_01);
      DataChunk::Flatten(pDVar7);
      pDVar7 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->(this_01);
      DataChunk::Verify(pDVar7);
    }
  }
  _Var3._M_head_impl = local_150._M_head_impl;
  local_150._M_head_impl = (TestVectorTypesData *)0x0;
  (_Var4._M_head_impl)->_vptr_GlobalTableFunctionState = (_func_int **)_Var3._M_head_impl;
  ::std::
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>_>
  ::~_Rb_tree(&local_120);
  ::std::vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>::~vector(&local_138);
  if (local_150._M_head_impl != (TestVectorTypesData *)0x0) {
    (*((local_150._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])
              ();
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(__uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )_Var4._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> TestVectorTypesInit(ClientContext &context, TableFunctionInitInput &input) {
	auto &bind_data = input.bind_data->Cast<TestVectorBindData>();

	auto result = make_uniq<TestVectorTypesData>();

	auto test_types = TestAllTypesFun::GetTestTypes();

	map<LogicalTypeId, TestType> test_type_map;
	for (auto &test_type : test_types) {
		test_type_map.insert(make_pair(test_type.type.id(), std::move(test_type)));
	}

	TestVectorInfo info(bind_data.types, test_type_map, result->entries);
	TestVectorFlat::Generate(info);
	TestVectorConstant::Generate(info);
	TestVectorDictionary::Generate(info);
	TestVectorSequence::Generate(info);
	for (auto &entry : result->entries) {
		entry->Verify();
	}
	if (bind_data.all_flat) {
		for (auto &entry : result->entries) {
			entry->Flatten();
			entry->Verify();
		}
	}
	return std::move(result);
}